

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_shuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  char *__src;
  char *local_48;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  int *status_local;
  LONGLONG length_local;
  char *heap_local;
  
  __src = (char *)malloc(length << 2);
  if (__src == (char *)0x0) {
    ffpmsg("malloc failed\n");
    heap_local._4_4_ = *status;
  }
  else {
    local_48 = heap;
    heapptr = __src;
    for (ptr = (char *)0x0; (long)ptr < length; ptr = ptr + 1) {
      *heapptr = *local_48;
      heapptr[length] = local_48[1];
      heapptr[length * 2] = local_48[2];
      heapptr[length * 3] = local_48[3];
      local_48 = local_48 + 4;
      heapptr = heapptr + 1;
    }
    memcpy(heap,__src,length << 2);
    free(__src);
    heap_local._4_4_ = *status;
  }
  return heap_local._4_4_;
}

Assistant:

static int fits_shuffle_4bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 4-byte integers or floats  */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    if (!ptr) {
      ffpmsg("malloc failed\n");
      return(*status);
    }

    heapptr = heap;
    cptr = ptr;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       cptr++;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);

    return(*status);
}